

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O1

void pacify_guards(void)

{
  monst *pmVar1;
  
  for (pmVar1 = level->monlist; pmVar1 != (monst *)0x0; pmVar1 = pmVar1->nmon) {
    if ((0 < pmVar1->mhp) && (pmVar1->data == mons + 0x126 || pmVar1->data == mons + 0x125)) {
      pmVar1->field_0x62 = pmVar1->field_0x62 | 0x40;
    }
  }
  return;
}

Assistant:

void pacify_guards(void)
{
	struct monst *mtmp;

	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
	    if (DEADMONSTER(mtmp)) continue;
	    if (mtmp->data == &mons[PM_WATCHMAN] ||
		mtmp->data == &mons[PM_WATCH_CAPTAIN])
	    mtmp->mpeaceful = 1;
	}
}